

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriggerVariable.hpp
# Opt level: O3

void __thiscall gmlc::concurrency::TriggerVariable::waitActivation(TriggerVariable *this)

{
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->activeLock;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if ((((this->activated)._M_base._M_i & 1U) == 0) && (((this->activated)._M_base._M_i & 1U) == 0))
  {
    do {
      std::condition_variable::wait((unique_lock *)&this->cv_active);
    } while (((this->activated)._M_base._M_i & 1U) == 0);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void waitActivation() const
    {
        std::unique_lock<std::mutex> lk(activeLock);
        if (!activated) {
            cv_active.wait(lk, [this] { return activated.load(); });
        }
    }